

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>_>
* __thiscall
llvm::
SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>_>
::operator=(SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>_>
            *this,SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>_>
                  *RHS)

{
  iterator MinSize;
  iterator pIVar1;
  InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
  *local_e0;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>_>
  *RHS_local;
  SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>_>
  *this_local;
  
  if (this != RHS) {
    MinSize = (iterator)
              (((long)(RHS->
                      super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                      ).
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                      .super_SmallVectorBase.EndX -
               (long)(RHS->
                     super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                     ).
                     super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                     .super_SmallVectorBase.BeginX) / 0x168);
    NewEnd = (iterator)
             (((long)(this->
                     super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                     ).
                     super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                     .super_SmallVectorBase.EndX -
              (long)(this->
                    super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                    ).
                    super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                    .super_SmallVectorBase.BeginX) / 0x168);
    if (NewEnd < MinSize) {
      pIVar1 = (iterator)
               SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
               ::capacity((SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                           *)this);
      if (pIVar1 < MinSize) {
        SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
        ::destroy_range((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                         *)(this->
                           super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                           ).
                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                           .super_SmallVectorBase.BeginX,
                        (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                         *)(this->
                           super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                           ).
                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                           .super_SmallVectorBase.EndX);
        SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
        ::setEnd((SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                  *)this,(InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                          *)(this->
                            super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                            ).
                            super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                            .super_SmallVectorBase.BeginX);
        NewEnd = (iterator)0x0;
        SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
        ::grow(&this->
                super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
               ,(size_t)MinSize);
      }
      else if (NewEnd != (iterator)0x0) {
        std::
        copy<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>>const*,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>>*>
                  ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                    *)(RHS->
                      super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                      ).
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                      .super_SmallVectorBase.BeginX,
                   (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                    *)((long)(RHS->
                             super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                             ).
                             super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                             .super_SmallVectorBase.BeginX + (long)NewEnd * 0x168),
                   (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                    *)(this->
                      super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                      ).
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                      .super_SmallVectorBase.BeginX);
      }
      SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>>,false>
      ::
      uninitialized_copy<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>>const*,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>>*>
                ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                  *)((long)(RHS->
                           super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                           ).
                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                           .super_SmallVectorBase.BeginX + (long)NewEnd * 0x168),
                 (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                  *)(RHS->
                    super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                    ).
                    super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                    .super_SmallVectorBase.EndX,
                 (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                  *)((long)(this->
                           super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                           ).
                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                           .super_SmallVectorBase.BeginX + (long)NewEnd * 0x168));
      SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
      ::setEnd((SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                *)this,(InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                        *)((long)(this->
                                 super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                                 ).
                                 super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                                 .super_SmallVectorBase.BeginX + (long)MinSize * 0x168));
    }
    else {
      if (MinSize == (iterator)0x0) {
        local_e0 = (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                    *)(this->
                      super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                      ).
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                      .super_SmallVectorBase.BeginX;
      }
      else {
        local_e0 = std::
                   copy<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>>const*,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>>*>
                             ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                               *)(RHS->
                                 super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                                 ).
                                 super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                                 .super_SmallVectorBase.BeginX,
                              (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                               *)((long)(RHS->
                                        super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                                        ).
                                        super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                                        .super_SmallVectorBase.BeginX + (long)MinSize * 0x168),
                              (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                               *)(this->
                                 super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                                 ).
                                 super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                                 .super_SmallVectorBase.BeginX);
      }
      SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
      ::destroy_range(local_e0,(InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                                *)(this->
                                  super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                                  ).
                                  super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                                  .super_SmallVectorBase.EndX);
      SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
      ::setEnd((SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                *)this,local_e0);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}